

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall addrman_tests::addrman_new_collisions::test_method(addrman_new_collisions *this)

{
  undefined1 **ppuVar1;
  __single_object _Var2;
  readonly_property65 rVar3;
  bool bVar4;
  int32_t consistency_check_ratio;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  initializer_list<CAddress> __l;
  const_string file_01;
  const_string file_02;
  initializer_list<CAddress> __l_00;
  const_string file_03;
  const_string file_04;
  initializer_list<CAddress> __l_01;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar9;
  uint local_2fc;
  size_t local_2f8;
  assertion_result local_2f0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  uint32_t num_addrs;
  __single_object addrman;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  shared_count local_1a0;
  char *local_198;
  assertion_result local_190;
  direct_or_indirect local_178;
  uint local_168;
  undefined1 *local_160;
  uint16_t local_158;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint16_t local_130;
  direct_or_indirect local_128;
  uint local_118;
  undefined1 *local_110;
  uint16_t local_108;
  direct_or_indirect local_100;
  uint local_f0;
  undefined1 *local_e8;
  uint16_t local_e0;
  direct_or_indirect local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  uint16_t local_b8;
  NodeSeconds local_b0;
  ServiceFlags local_a8;
  direct_or_indirect local_a0;
  undefined1 *local_90;
  undefined1 *local_88;
  uint16_t local_80;
  direct_or_indirect local_78;
  uint local_68;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio =
       GetCheckRatio((NodeContext *)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  local_d8.indirect_contents.indirect = (char *)&local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_78.indirect_contents,(string *)&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.indirect_contents.indirect != &local_c8) {
    operator_delete(local_d8.indirect_contents.indirect,(ulong)(local_c8._M_allocated_capacity + 1))
    ;
  }
  num_addrs = 0;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x123;
  file.m_begin = (iterator)&local_1d0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1e0,msg);
  local_150[8] = false;
  local_150._0_8_ = &PTR__lazy_ostream_013ae088;
  local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_140._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1a8 = (undefined1  [8])
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_190._0_8_ = local_1a8;
  local_1a0.pi_ = (sp_counted_base *)&num_addrs;
  local_58[0] = local_1a8 == (undefined1  [8])(ulong)num_addrs;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_2f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f0.m_message.px = (element_type *)0xe59ad8;
  local_c8._8_8_ = &local_190;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_88 = (undefined1 *)&local_1a0;
  local_a0.direct[8] = '\0';
  local_a0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae108;
  local_90 = boost::unit_test::lazy_ostream::inst;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_150,1,2,REQUIRE,0xe59af2,
             (size_t)&local_2f0,0x123,(iterator)&local_d8,"num_addrs",&local_a0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  if (num_addrs < 0x16) {
    do {
      num_addrs = num_addrs + 1;
      util::ToString<unsigned_int>((string *)local_150,&num_addrs);
      pvVar7 = &DAT_00000008;
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((string *)local_150,0,0,"250.1.1.",8);
      local_d8.indirect_contents.indirect = (pbVar5->_M_dataplus)._M_p;
      paVar6 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.indirect_contents.indirect == paVar6) {
        local_c8._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_c8._8_8_ = *(long *)((long)&pbVar5->field_2 + 8);
        local_d8.indirect_contents.indirect = (char *)&local_c8;
      }
      else {
        local_c8._M_allocated_capacity = paVar6->_M_allocated_capacity;
      }
      local_d8._8_8_ = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      ResolveService((CService *)&local_a0,(string *)&local_d8,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.indirect_contents.indirect != &local_c8) {
        operator_delete(local_d8.indirect_contents.indirect,
                        (ulong)(local_c8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._0_8_ != &local_140) {
        operator_delete((void *)local_150._0_8_,(ulong)(local_140._M_allocated_capacity + 1));
      }
      local_1f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_1e8 = "";
      local_200 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x127;
      file_00.m_begin = (iterator)&local_1f0;
      msg_00.m_end = pvVar8;
      msg_00.m_begin = pvVar7;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_200,
                 msg_00);
      _Var2 = addrman;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_100.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a0);
      local_e8 = local_88;
      local_e0 = local_80;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d8,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_100.indirect_contents);
      local_c8._8_8_ = local_e8;
      local_b8 = local_e0;
      local_b0.__d.__r = (duration)100000000;
      local_a8 = NODE_NONE;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_d8;
      std::vector<CAddress,_std::allocator<CAddress>_>::vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_2f0,__l,
                 (allocator_type *)&local_1a0);
      _cVar9 = 0x226a0f;
      rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           AddrMan::Add((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                        (vector<CAddress,_std::allocator<CAddress>_> *)&local_2f0,
                        (CNetAddr *)&local_78.indirect_contents,(seconds)0x0);
      local_58[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
      local_58._8_8_ = (element_type *)0x0;
      aStack_48._M_allocated_capacity = 0;
      local_190._0_8_ = "addrman->Add({CAddress(addr, NODE_NONE)}, source)";
      local_190.m_message.px = (element_type *)0xe5a4ba;
      local_150[8] = false;
      local_150._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_140._8_8_ = &local_190;
      local_210 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_208 = "";
      pvVar8 = (iterator)0x1;
      pvVar7 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_58,(lazy_ostream *)local_150,1,0,WARN,_cVar9,
                 (size_t)&local_210,0x127);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector
                ((vector<CAddress,_std::allocator<CAddress>_> *)&local_2f0);
      if (0x10 < (uint)local_c8._M_allocated_capacity._0_4_) {
        free(local_d8.indirect_contents.indirect);
        local_d8.indirect_contents.indirect = (char *)0x0;
      }
      if (0x10 < local_f0) {
        free(local_100.indirect_contents.indirect);
        local_100.indirect_contents.indirect = (char *)0x0;
      }
      local_220 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_218 = "";
      local_230 = &boost::unit_test::basic_cstring<char_const>::null;
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0x12a;
      file_01.m_begin = (iterator)&local_220;
      msg_01.m_end = pvVar7;
      msg_01.m_begin = pvVar8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_230,
                 msg_01);
      local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
      local_58._0_8_ = &PTR__lazy_ostream_013ae088;
      aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      aStack_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_1b0 = (undefined1  [8])
                  AddrMan::Size((AddrMan *)
                                addrman._M_t.
                                super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                                super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                                super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                (optional<Network>)0x0,(optional<bool>)0x0);
      local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)
           (readonly_property<bool>)(local_1b0 == (undefined1  [8])(ulong)num_addrs);
      local_2f0.m_message.px = (element_type *)0x0;
      local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_190._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
      ;
      local_190.m_message.px = (element_type *)0xe59ad8;
      local_1a0.pi_ = (sp_counted_base *)local_1b0;
      local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
      local_d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
      local_c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_c8._8_8_ = &local_1a0;
      local_1a8 = (undefined1  [8])&num_addrs;
      local_150[8] = false;
      local_150._0_8_ = &PTR__lazy_ostream_013ae108;
      local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_140._8_8_ = local_1a8;
      pvVar8 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_2f0,(lazy_ostream *)local_58,1,2,REQUIRE,0xe59af2,(size_t)&local_190,0x12a,
                 (iterator)&local_d8,"num_addrs",(string *)local_150);
      boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
      if (0x10 < (uint)local_90) {
        free(local_a0.indirect_contents.indirect);
      }
    } while (num_addrs < 0x16);
  }
  num_addrs = num_addrs + 1;
  util::ToString<unsigned_int>((string *)local_150,&num_addrs);
  pvVar7 = &DAT_00000008;
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150
                      ,0,0,"250.1.1.",8);
  local_d8.indirect_contents.indirect = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.indirect_contents.indirect == paVar6) {
    local_c8._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_c8._8_8_ = *(long *)((long)&pbVar5->field_2 + 8);
    local_d8.indirect_contents.indirect = (char *)&local_c8;
  }
  else {
    local_c8._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_d8._8_8_ = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  ResolveService((CService *)&local_a0,(string *)&local_d8,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.indirect_contents.indirect != &local_c8) {
    operator_delete(local_d8.indirect_contents.indirect,(ulong)(local_c8._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_,(ulong)(local_140._M_allocated_capacity + 1));
  }
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x130;
  file_02.m_begin = (iterator)&local_240;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_250,
             msg_02);
  _Var2 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_a0);
  local_110 = local_88;
  local_108 = local_80;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_128.indirect_contents);
  local_c8._8_8_ = local_110;
  local_b8 = local_108;
  local_b0.__d.__r = (duration)100000000;
  local_a8 = NODE_NONE;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_2f0,__l_00,
             (allocator_type *)&local_1a0);
  _cVar9 = 0x226ec9;
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)&local_2f0,
                    (CNetAddr *)&local_78.indirect_contents,(seconds)0x0);
  local_58[0] = rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_190._0_8_ = "addrman->Add({CAddress(addr1, NODE_NONE)}, source)";
  local_190.m_message.px = (element_type *)0xe59b62;
  local_150[8] = false;
  local_150._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_140._8_8_ = &local_190;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_258 = "";
  pvVar8 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_150,1,0,WARN,_cVar9,
             (size_t)&local_260,0x130);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_2f0);
  if (0x10 < (uint)local_c8._M_allocated_capacity._0_4_) {
    free(local_d8.indirect_contents.indirect);
    local_d8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_118) {
    free(local_128.indirect_contents.indirect);
    local_128.indirect_contents.indirect = (char *)0x0;
  }
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x131;
  file_03.m_begin = (iterator)&local_270;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_280,
             msg_03);
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae088;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_48._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1b0 = (undefined1  [8])
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_2f8 = CONCAT44(local_2f8._4_4_,num_addrs - 1);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_1b0 == (undefined1  [8])(ulong)(num_addrs - 1));
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_190._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_190.m_message.px = (element_type *)0xe59ad8;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_150[8] = false;
  local_150._0_8_ = &PTR__lazy_ostream_013ae108;
  local_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_140._8_8_ = local_1a8;
  pvVar7 = (iterator)0x2;
  local_1a8 = (undefined1  [8])&local_2f8;
  local_1a0.pi_ = (sp_counted_base *)local_1b0;
  local_c8._8_8_ = (allocator_type *)&local_1a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_58,1,2,REQUIRE,0xe59af2,(size_t)&local_190,0x131,
             (iterator)&local_d8,"num_addrs - collisions",(lazy_ostream *)local_150);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  num_addrs = num_addrs + 1;
  util::ToString<unsigned_int>((string *)local_58,&num_addrs);
  pvVar8 = &DAT_00000008;
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                      0,0,"250.1.1.",8);
  local_d8.indirect_contents.indirect = (char *)&local_c8;
  ppuVar1 = (undefined1 **)(pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)ppuVar1 == paVar6) {
    local_c8._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_c8._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_c8._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_d8.indirect_contents.indirect = (char *)ppuVar1;
  }
  local_d8._8_8_ = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  ResolveService((CService *)local_150,(string *)&local_d8,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.indirect_contents.indirect != &local_c8) {
    operator_delete(local_d8.indirect_contents.indirect,(ulong)(local_c8._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x134;
  file_04.m_begin = (iterator)&local_290;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2a0,
             msg_04);
  _Var2 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_150);
  local_160 = (undefined1 *)local_140._8_8_;
  local_158 = local_130;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178.indirect_contents);
  local_c8._8_8_ = local_160;
  local_b8 = local_158;
  local_b0.__d.__r = (duration)100000000;
  local_a8 = NODE_NONE;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_190,__l_01,
             (allocator_type *)local_1a8);
  _cVar9 = 0x227314;
  bVar4 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_190,
                       (CNetAddr *)&local_78.indirect_contents,(seconds)0x0);
  local_2f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar4;
  local_2f0.m_message.px = (element_type *)0x0;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a0.pi_ = (sp_counted_base *)0xe59be2;
  local_198 = "";
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae1c8;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2a8 = "";
  pvVar8 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  aStack_48._8_8_ = (allocator_type *)&local_1a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_2f0,(lazy_ostream *)local_58,1,0,WARN,_cVar9,(size_t)&local_2b0,0x134);
  boost::detail::shared_count::~shared_count(&local_2f0.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_190);
  if (0x10 < (uint)local_c8._M_allocated_capacity._0_4_) {
    free(local_d8.indirect_contents.indirect);
    local_d8.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_168) {
    free(local_178.indirect_contents.indirect);
    local_178.indirect_contents.indirect = (char *)0x0;
  }
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/addrman_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x135;
  file_05.m_begin = (iterator)&local_2c0;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2d0,
             msg_05);
  local_2f0.m_message.px = (element_type *)((ulong)local_2f0.m_message.px & 0xffffffffffffff00);
  local_2f0._0_8_ = &PTR__lazy_ostream_013ae088;
  local_2f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_2d8 = "";
  local_2f8 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_2fc = num_addrs - 1;
  local_1b0 = (undefined1  [8])&local_2fc;
  local_190.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_2f8 == local_2fc);
  local_190.m_message.px = (element_type *)0x0;
  local_190.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a0.pi_ = (sp_counted_base *)0xe59a79;
  local_198 = "";
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_d8.indirect_contents.indirect = (char *)&PTR__lazy_ostream_013ae0c8;
  local_c8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013ae108;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_1a8 = (undefined1  [8])&local_2f8;
  local_c8._8_8_ = (allocator_type *)local_1a8;
  aStack_48._8_8_ = (sp_counted_base *)local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_190,(lazy_ostream *)&local_2f0,1,2,REQUIRE,0xe59af2,(size_t)&local_1a0,0x135,
             (iterator)&local_d8,"num_addrs - collisions",(lazy_ostream *)local_58);
  boost::detail::shared_count::~shared_count(&local_190.m_message.pn);
  if (0x10 < (uint)local_140._M_allocated_capacity._0_4_) {
    free((void *)local_150._0_8_);
  }
  if (0x10 < (uint)local_90) {
    free(local_a0.indirect_contents.indirect);
  }
  if (0x10 < local_68) {
    free(local_78.indirect_contents.indirect);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_new_collisions)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));

    CNetAddr source = ResolveIP("252.2.2.2");

    uint32_t num_addrs{0};

    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs);

    while (num_addrs < 22) { // Magic number! 250.1.1.1 - 250.1.1.22 do not collide with deterministic key = 1
        CService addr = ResolveService("250.1.1." + ToString(++num_addrs));
        BOOST_CHECK(addrman->Add({CAddress(addr, NODE_NONE)}, source));

        // Test: No collision in new table yet.
        BOOST_CHECK_EQUAL(addrman->Size(), num_addrs);
    }

    // Test: new table collision!
    CService addr1 = ResolveService("250.1.1." + ToString(++num_addrs));
    uint32_t collisions{1};
    BOOST_CHECK(addrman->Add({CAddress(addr1, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs - collisions);

    CService addr2 = ResolveService("250.1.1." + ToString(++num_addrs));
    BOOST_CHECK(addrman->Add({CAddress(addr2, NODE_NONE)}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), num_addrs - collisions);
}